

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall
luna::Function::AddLocalVar(Function *this,String *name,int register_id,int begin_pc,int end_pc)

{
  vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_> *this_00;
  int in_ECX;
  int in_EDX;
  String *in_RSI;
  long in_RDI;
  int in_R8D;
  value_type *in_stack_ffffffffffffffb8;
  LocalVarInfo local_38 [2];
  
  this_00 = (vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_> *)
            (in_RDI + 0x60);
  LocalVarInfo::LocalVarInfo(local_38,in_RSI,in_EDX,in_ECX,in_R8D);
  std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>::
  push_back(this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void Function::AddLocalVar(String *name, int register_id,
                               int begin_pc, int end_pc)
    {
        local_vars_.push_back(LocalVarInfo(name, register_id, begin_pc, end_pc));
    }